

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

void __thiscall
TArray<FSaveGameNode_*,_FSaveGameNode_*>::Insert
          (TArray<FSaveGameNode_*,_FSaveGameNode_*> *this,uint index,FSaveGameNode **item)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = this->Count;
  if (uVar2 < index || uVar2 - index == 0) {
    uVar1 = index + 1;
    if (uVar2 <= uVar1 && uVar1 - uVar2 != 0) {
      Grow(this,uVar1 - uVar2);
    }
    this->Count = uVar1;
  }
  else {
    if (uVar2 + 1 != 0) {
      Grow(this,1);
    }
    this->Count = uVar2 + 1;
    memmove(this->Array + (ulong)index + 1,this->Array + index,(ulong)(uVar2 - index) << 3);
  }
  this->Array[index] = *item;
  return;
}

Assistant:

void Insert (unsigned int index, const T &item)
	{
		if (index >= Count)
		{
			// Inserting somewhere past the end of the array, so we can
			// just add it without moving things.
			Resize (index + 1);
			::new ((void *)&Array[index]) T(item);
		}
		else
		{
			// Inserting somewhere in the middle of the array,
			// so make room for it
			Resize (Count + 1);

			// Now move items from the index and onward out of the way
			memmove (&Array[index+1], &Array[index], sizeof(T)*(Count - index - 1));

			// And put the new element in
			::new ((void *)&Array[index]) T(item);
		}
	}